

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

int Abc_NtkDontCareWinAddMissing_rec(Odc_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  uVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = Abc_NodeTravId(pObj);
    if (((iVar1 == pObj->pNtk->nTravIds + -1) &&
        (uVar2 = *(uint *)&pObj->field_0x14 & 0xf, uVar2 != 2)) && (uVar2 != 5)) {
      lVar3 = 0;
      do {
        if ((pObj->vFanins).nSize <= lVar3) {
          return 1;
        }
        iVar1 = Abc_NtkDontCareWinAddMissing_rec
                          (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]]);
        lVar3 = lVar3 + 1;
      } while (iVar1 != 0);
      uVar2 = 0;
    }
    else {
      Abc_NodeSetTravIdCurrent(pObj);
      Vec_PtrPush(p->vBranches,pObj);
      uVar2 = (uint)(p->vBranches->nSize < 0x21);
    }
  }
  return uVar2;
}

Assistant:

int Abc_NtkDontCareWinAddMissing_rec( Odc_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip the already collected leaves and branches
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 1;
    // if this is not an internal node - make it a new branch
    if ( !Abc_NodeIsTravIdPrevious(pObj) || Abc_ObjIsCi(pObj) ) //|| (int)pObj->Level <= p->nLevLeaves )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        Vec_PtrPush( p->vBranches, pObj );
        return Vec_PtrSize(p->vBranches) <= 32;
    }
    // visit the fanins of the node
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( !Abc_NtkDontCareWinAddMissing_rec( p, pFanin ) )
            return 0;
    return 1;
}